

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

int64_t __thiscall absl::lts_20250127::ToUnixMillis(lts_20250127 *this,Time t)

{
  int64_t iVar1;
  long lVar2;
  Duration num;
  Duration rem;
  Duration local_18;
  
  num.rep_lo_ = t.rep_.rep_hi_.lo_;
  if ((ulong)this >> 0x35 != 0) {
    local_18.rep_lo_ = 0;
    local_18.rep_hi_.lo_ = 0;
    local_18.rep_hi_.hi_ = 0;
    num.rep_hi_ = (HiRep)this;
    iVar1 = IDivDuration(num,(Duration)(ZEXT412(4000000) << 0x40),&local_18);
    lVar2 = iVar1 + -1;
    if (-1 < (long)local_18.rep_hi_) {
      lVar2 = iVar1;
    }
    if (0 < iVar1) {
      lVar2 = iVar1;
    }
    return lVar2;
  }
  return ((ulong)t.rep_.rep_hi_ & 0xffffffff) / 4000000 + (long)this * 1000;
}

Assistant:

int64_t ToUnixMillis(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 53 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) /
            (4000 * 1000));
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Milliseconds(1));
}